

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_move_uint32_iterator_equalorlarger(roaring_uint32_iterator_t *it,uint32_t val)

{
  byte bVar1;
  _Bool _Var2;
  uint16_t uVar3;
  int32_t iVar4;
  uint16_t lb;
  uint32_t lowvalue;
  int i;
  uint16_t hb;
  uint32_t val_local;
  roaring_uint32_iterator_t *it_local;
  
  iVar4 = ra_get_index(&it->parent->high_low_container,(uint16_t)(val >> 0x10));
  if (iVar4 < 0) {
    it->container_index = -1 - iVar4;
  }
  else {
    uVar3 = container_maximum((it->parent->high_low_container).containers[iVar4],
                              (it->parent->high_low_container).typecodes[iVar4]);
    if ((val & 0xffff) <= (uint)uVar3) {
      it->container_index = iVar4;
      _Var2 = loadfirstvalue_largeorequal(it,val);
      it->has_value = _Var2;
      bVar1 = it->has_value;
      goto LAB_00147aaf;
    }
    it->container_index = iVar4 + 1;
  }
  _Var2 = loadfirstvalue(it);
  it->has_value = _Var2;
  bVar1 = it->has_value;
LAB_00147aaf:
  it_local._7_1_ = (_Bool)(bVar1 & 1);
  return it_local._7_1_;
}

Assistant:

bool roaring_move_uint32_iterator_equalorlarger(roaring_uint32_iterator_t *it, uint32_t val) {
    uint16_t hb = val >> 16;
    const int i = ra_get_index(& it->parent->high_low_container, hb);
    if (i >= 0) {
      uint32_t lowvalue = container_maximum(it->parent->high_low_container.containers[i], it->parent->high_low_container.typecodes[i]);
      uint16_t lb = val & 0xFFFF;
      if(lowvalue < lb ) {
        it->container_index = i+1; // will have to load first value of next container
      } else {// the value is necessarily within the range of the container
        it->container_index = i;
        it->has_value = loadfirstvalue_largeorequal(it, val);
        return it->has_value;
      }
    } else {
      // there is no matching, so we are going for the next container
      it->container_index = -i-1;
    }
    it->has_value = loadfirstvalue(it);
    return it->has_value;
}